

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O0

int ffgclsb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           long elemincre,int nultyp,char nulval,char *array,char *nularray,int *anynul,int *status)

{
  char *pcVar1;
  long local_72a8;
  long local_7298;
  long local_7288;
  u_tag u;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char local_198 [8];
  char message [81];
  char local_138 [8];
  char tform [20];
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int readcheck;
  int nulcheck;
  long ntodo;
  long xwidth;
  long ii;
  long incre;
  long twidth;
  int local_98;
  int decimals;
  int xcode;
  int hdutype;
  int maxelem;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  long elemincre_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  dtemp = 1.0;
  repeat._0_4_ = 0;
  if ((*status < 1) && (nelem != 0)) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    scale = (double)elemincre;
    elemincre_local = nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    if ((long)scale < 0) {
      repeat._0_4_ = -1;
    }
    ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,elemincre_local,(int)repeat
             ,&zero,&power,local_138,&incre,&hdutype,&xcode,&elemnum,&readptr,&ii,&startpos,&rownum,
             &decimals,&rowlen,(char *)(cbuff + 0xe0f),status);
    if ((hdutype == 0xe) && (scale == 4.94065645841247e-324)) {
      ffgcll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,elemincre_local,nultyp,
             nulval,array,nularray,anynul,status);
      fptr_local._4_4_ = *status;
    }
    else {
      pcVar1 = strchr(local_138,0x41);
      if (pcVar1 != (char *)0x0) {
        if (*status == 0x134) {
          *status = 0;
          ffcmsg();
        }
        hdutype = 0xb;
        ii = 1;
        startpos = incre;
        incre = 1;
        zero = 1.0;
        power = 0.0;
        rowlen = 0x4995cdd1;
        xcode = 0x7080;
      }
      if (*status < 1) {
        ii = (long)scale * ii;
        if ((hdutype == 0x10) && (decimals == 1)) {
          ffasfm(local_138,&local_98,&ntodo,(int *)((long)&twidth + 4),status);
          for (xwidth = 0; xwidth < twidth._4_4_; xwidth = xwidth + 1) {
            dtemp = dtemp * 10.0;
          }
        }
        repeat._4_4_ = nultyp;
        if ((nultyp == 1) && (nulval == '\0')) {
          repeat._4_4_ = 0;
        }
        else if ((hdutype % 10 == 1) && (rowlen == 0x4995cdd1)) {
          repeat._4_4_ = 0;
        }
        else if ((hdutype == 0x15) && ((0x7fff < rowlen || (rowlen < -0x8000)))) {
          repeat._4_4_ = 0;
        }
        else if ((hdutype == 0xb) && ((0xff < rowlen || (rowlen < 0)))) {
          repeat._4_4_ = 0;
        }
        else if ((hdutype == 0x10) && (cbuff[0xe0f]._0_1_ == '\x01')) {
          repeat._4_4_ = 0;
        }
        next = elemincre_local;
        rowincre = 0;
        remain = 0;
        while (next != 0) {
          if (next < xcode) {
            local_7288 = next;
          }
          else {
            local_7288 = (long)xcode;
          }
          if ((long)scale < 0) {
            if (local_7288 < readptr / -(long)scale + 1) {
              local_72a8 = local_7288;
            }
            else {
              local_72a8 = readptr / -(long)scale + 1;
            }
            _readcheck = local_72a8;
          }
          else {
            if (local_7288 < ((startpos - readptr) + -1) / (long)scale + 1) {
              local_7298 = local_7288;
            }
            else {
              local_7298 = ((startpos - readptr) + -1) / (long)scale + 1;
            }
            _readcheck = local_7298;
          }
          tnull = elemnum + remain * rownum + readptr * (ii / (long)scale);
          if (hdutype == 0xb) {
            ffgi1b(pfStack_40,tnull,_readcheck,ii,(uchar *)(array + rowincre),status);
            fffi1s1((uchar *)(array + rowincre),_readcheck,zero,power,repeat._4_4_,(uchar)rowlen,
                    nulval,nularray + rowincre,anynul,array + rowincre,status);
          }
          else if (hdutype == 0x10) {
            ffmbyt(pfStack_40,tnull,0,status);
            if (ii == incre) {
              ffgbyt(pfStack_40,_readcheck * incre,&buffer,status);
            }
            else {
              ffgbytoff(pfStack_40,incre,_readcheck,ii - incre,&buffer,status);
            }
            fffstrs1((char *)&buffer,_readcheck,zero,power,incre,dtemp,repeat._4_4_,
                     (char *)(cbuff + 0xe0f),nulval,nularray + rowincre,anynul,array + rowincre,
                     status);
          }
          else if (hdutype == 0x15) {
            ffgi2b(pfStack_40,tnull,_readcheck,ii,(short *)&buffer,status);
            fffi2s1((short *)&buffer,_readcheck,zero,power,repeat._4_4_,(short)rowlen,nulval,
                    nularray + rowincre,anynul,array + rowincre,status);
          }
          else if (hdutype == 0x29) {
            ffgi4b(pfStack_40,tnull,_readcheck,ii,(int *)&buffer,status);
            fffi4s1((int *)&buffer,_readcheck,zero,power,repeat._4_4_,(int)rowlen,nulval,
                    nularray + rowincre,anynul,array + rowincre,status);
          }
          else if (hdutype == 0x2a) {
            ffgr4b(pfStack_40,tnull,_readcheck,ii,(float *)&buffer,status);
            fffr4s1((float *)&buffer,_readcheck,zero,power,repeat._4_4_,nulval,nularray + rowincre,
                    anynul,array + rowincre,status);
          }
          else if (hdutype == 0x51) {
            ffgi8b(pfStack_40,tnull,_readcheck,ii,(long *)&buffer,status);
            fffi8s1((LONGLONG *)&buffer,_readcheck,zero,power,repeat._4_4_,rowlen,nulval,
                    nularray + rowincre,anynul,array + rowincre,status);
          }
          else {
            if (hdutype != 0x52) {
              snprintf(local_198,0x51,"Cannot read bytes from column %d which has format %s",
                       (ulong)firstrow_local._4_4_,local_138);
              ffpmsg(local_198);
              if (decimals == 1) {
                *status = 0x137;
                return 0x137;
              }
              *status = 0x138;
              return 0x138;
            }
            ffgr8b(pfStack_40,tnull,_readcheck,ii,(double *)&buffer,status);
            fffr8s1((double *)&buffer,_readcheck,zero,power,repeat._4_4_,nulval,nularray + rowincre,
                    anynul,array + rowincre,status);
          }
          if (0 < *status) {
            _maxelem = (double)rowincre;
            if (decimals < 1) {
              snprintf(local_198,0x51,"Error reading elements %.0f thru %.0f from image (ffgclsb).",
                       _maxelem + 1.0,_maxelem + (double)_readcheck);
            }
            else {
              snprintf(local_198,0x51,
                       "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
                       _maxelem + 1.0,_maxelem + (double)_readcheck,(ulong)firstrow_local._4_4_);
            }
            ffpmsg(local_198);
            return *status;
          }
          next = next - _readcheck;
          if (next != 0) {
            rowincre = _readcheck + rowincre;
            readptr = readptr + _readcheck * (long)scale;
            if (readptr < startpos) {
              if (readptr < 0) {
                register0x00000000 = (-1 - readptr) / startpos + 1;
                remain = remain - register0x00000000;
                readptr = register0x00000000 * startpos + readptr;
              }
            }
            else {
              register0x00000000 = readptr / startpos;
              remain = register0x00000000 + remain;
              readptr = readptr - register0x00000000 * startpos;
            }
          }
        }
        if (*status == -0xb) {
          ffpmsg("Numerical overflow during type conversion while reading FITS data.");
          *status = 0x19c;
        }
        fptr_local._4_4_ = *status;
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgclsb(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            signed char nulval,   /* I - value for null pixels if nultyp = 1 */
            signed char *array,   /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       signed char scharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);

    /* special case: read column of T/F logicals */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.scharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (strchr(tform,'A') != NULL) 
    {
        if (*status == BAD_ELEM_NUM)
        {
            /* ignore this error message */
            *status = 0;
            ffcmsg();   /* clear error stack */
        }

        /*  interpret a 'A' ASCII column as a 'B' byte column ('8A' == '8B') */
        /*  This is an undocumented 'feature' in CFITSIO */

        /*  we have to reset some of the values returned by ffgcpr */
        
        tcode = TBYTE;
        incre = 1;         /* each element is 1 byte wide */
        repeat = twidth;   /* total no. of chars in the col */
        twidth = 1;        /* width of each element */
        scale = 1.0;       /* no scaling */
        zero  = 0.0;
        tnull = NULL_UNDEFINED;  /* don't test for nulls */
        maxelem = DBUFFSIZE;
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + (rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) &array[next], status);
                fffi1s1((unsigned char *)&array[next], ntodo, scale, zero,
                        nulcheck, (unsigned char) tnull, nulval, &nularray[next], 
                        anynul, &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2s1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4s1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8s1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4s1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8s1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstrs1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclsb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}